

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

iterator __thiscall
QList<QAbstractFileEngineHandler_*>::erase
          (QList<QAbstractFileEngineHandler_*> *this,const_iterator abegin,const_iterator aend)

{
  Data *pDVar1;
  iterator iVar2;
  QAbstractFileEngineHandler **ppQVar3;
  long lVar4;
  
  ppQVar3 = (this->d).ptr;
  lVar4 = (long)abegin.i - (long)ppQVar3;
  if ((long)aend.i - (long)abegin.i != 0) {
    pDVar1 = (this->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QArrayDataPointer<QAbstractFileEngineHandler_*>::reallocateAndGrow
                (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QAbstractFileEngineHandler_*> *)0x0);
      ppQVar3 = (this->d).ptr;
    }
    QtPrivate::QPodArrayOps<QAbstractFileEngineHandler_*>::erase
              ((QPodArrayOps<QAbstractFileEngineHandler_*> *)this,
               (QAbstractFileEngineHandler **)((long)ppQVar3 + lVar4),
               (long)aend.i - (long)abegin.i >> 3);
  }
  iVar2 = begin(this);
  return (iterator)(iVar2.i + lVar4);
}

Assistant:

typename QList<T>::iterator QList<T>::erase(const_iterator abegin, const_iterator aend)
{
    Q_ASSERT_X(isValidIterator(abegin), "QList::erase", "The specified iterator argument 'abegin' is invalid");
    Q_ASSERT_X(isValidIterator(aend), "QList::erase", "The specified iterator argument 'aend' is invalid");
    Q_ASSERT(aend >= abegin);

    qsizetype i = std::distance(constBegin(), abegin);
    qsizetype n = std::distance(abegin, aend);
    remove(i, n);

    return begin() + i;
}